

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O1

uint128 CityHash128WithSeed(char *s,size_t len,uint128 seed)

{
  uint64 uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long *plVar13;
  uint128 uVar14;
  
  uVar8 = seed.second;
  uVar5 = seed.first;
  if (len < 0x80) {
    if (len < 0x11) {
      uVar5 = (uVar5 * -0x4b6d499041670d8d >> 0x2f ^ uVar5 * -0x4b6d499041670d8d) *
              -0x4b6d499041670d8d;
      uVar1 = HashLen0to16(s,len);
      uVar2 = uVar1 + uVar8 * -0x4b6d499041670d8d;
      uVar10 = uVar2;
      if (7 < len) {
        uVar10 = *(ulong *)s;
      }
      uVar3 = uVar10 + uVar5 >> 0x2f ^ uVar10 + uVar5;
    }
    else {
      uVar10 = (*(long *)(s + (len - 8)) + 0xb492b66fbe98f273U ^ uVar5) * -0x622015f714c7d297;
      uVar10 = (uVar10 >> 0x2f ^ uVar5 ^ uVar10) * -0x622015f714c7d297;
      uVar2 = (uVar10 >> 0x2f ^ uVar10) * -0x622015f714c7d297;
      uVar10 = (uVar8 + len ^ *(long *)(s + (len - 0x10)) + uVar2) * -0x622015f714c7d297;
      uVar10 = (uVar10 >> 0x2f ^ *(long *)(s + (len - 0x10)) + uVar2 ^ uVar10) * -0x622015f714c7d297
      ;
      uVar3 = (uVar10 >> 0x2f ^ uVar10) * -0x622015f714c7d297;
      uVar5 = uVar5 + uVar3;
      do {
        uVar5 = (((ulong)(*(long *)s * -0x4b6d499041670d8d) >> 0x2f ^
                 *(long *)s * -0x4b6d499041670d8d) * -0x4b6d499041670d8d ^ uVar5) *
                -0x4b6d499041670d8d;
        uVar8 = uVar8 ^ uVar5;
        uVar2 = (((ulong)(*(long *)((long)s + 8) * -0x4b6d499041670d8d) >> 0x2f ^
                 *(long *)((long)s + 8) * -0x4b6d499041670d8d) * -0x4b6d499041670d8d ^ uVar2) *
                -0x4b6d499041670d8d;
        uVar3 = uVar3 ^ uVar2;
        s = (char *)((long)s + 0x10);
        len = len - 0x10;
      } while (0x10 < len);
    }
    uVar5 = (uVar5 ^ uVar2) * -0x622015f714c7d297;
    uVar5 = (uVar5 >> 0x2f ^ uVar2 ^ uVar5) * -0x622015f714c7d297;
    uVar10 = (uVar5 >> 0x2f ^ uVar5) * -0x622015f714c7d297;
    uVar5 = (uVar3 ^ uVar8) * -0x622015f714c7d297;
    uVar5 = (uVar5 >> 0x2f ^ uVar8 ^ uVar5) * -0x622015f714c7d297;
    uVar8 = (uVar5 >> 0x2f ^ uVar5) * -0x622015f714c7d297 ^ uVar10;
    uVar5 = uVar8;
  }
  else {
    uVar3 = ((uVar8 ^ 0xb492b66fbe98f273) << 0xf | (uVar8 ^ 0xb492b66fbe98f273) >> 0x31) *
            -0x4b6d499041670d8d + *(long *)s;
    uVar10 = len * -0x4b6d499041670d8d;
    lVar6 = (uVar3 * 0x400000 | uVar3 >> 0x2a) * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar11 = ((uVar10 + uVar8) * 0x20000000 | uVar10 + uVar8 >> 0x23) * -0x4b6d499041670d8d + uVar5;
    uVar2 = ((*(long *)(s + 0x58) + uVar5) * 0x800 | *(long *)(s + 0x58) + uVar5 >> 0x35) *
            -0x4b6d499041670d8d;
    plVar13 = (long *)(s + 0x78);
    sVar9 = len;
    do {
      uVar4 = uVar5 + uVar3 + uVar8 + plVar13[-0xd];
      uVar8 = uVar8 + lVar6 + plVar13[-9];
      uVar5 = (uVar10 ^ uVar11) << 0x1f | (uVar10 ^ uVar11) >> 0x21;
      uVar4 = (uVar4 * 0x8000000 | uVar4 >> 0x25) * -0x4b6d499041670d8d ^ uVar2;
      lVar7 = lVar6 * -0x4b6d499041670d8d + plVar13[-0xf];
      uVar3 = (uVar8 * 0x400000 | uVar8 >> 0x2a) * -0x4b6d499041670d8d ^ uVar3;
      uVar11 = uVar11 + plVar13[-0xc] + lVar7 + uVar4;
      uVar12 = plVar13[-0xd] + plVar13[-0xe] + lVar7;
      uVar8 = uVar12 + plVar13[-0xc];
      lVar6 = uVar2 + uVar5 + plVar13[-0xb];
      uVar2 = lVar6 + plVar13[-8] + uVar3;
      uVar10 = plVar13[-10] + lVar6 + plVar13[-9];
      lVar7 = (uVar12 * 0x100000 | uVar12 >> 0x2c) + lVar7 + (uVar11 << 0x2b | uVar11 >> 0x15);
      uVar11 = uVar10 + plVar13[-8];
      uVar12 = (uVar10 * 0x100000 | uVar10 >> 0x2c) + lVar6 + (uVar2 << 0x2b | uVar2 >> 0x15);
      uVar10 = uVar5 + uVar8 + plVar13[-5] + uVar3;
      uVar2 = uVar3 + plVar13[-1] + lVar7;
      uVar4 = uVar4 ^ uVar11;
      uVar5 = uVar4 << 0x1f | uVar4 >> 0x21;
      uVar10 = (uVar10 * 0x8000000 | uVar10 >> 0x25) * -0x4b6d499041670d8d ^ uVar12;
      lVar6 = lVar7 * -0x4b6d499041670d8d + plVar13[-7];
      uVar11 = uVar11 + uVar10 + plVar13[-4] + lVar6;
      uVar4 = plVar13[-6] + lVar6 + plVar13[-5];
      uVar8 = (uVar2 * 0x400000 | uVar2 >> 0x2a) * -0x4b6d499041670d8d ^ uVar8;
      uVar3 = uVar4 + plVar13[-4];
      lVar6 = (uVar11 << 0x2b | uVar11 >> 0x15) + lVar6 + (uVar4 * 0x100000 | uVar4 >> 0x2c);
      lVar7 = uVar12 + uVar5 + plVar13[-3];
      uVar4 = lVar7 + *plVar13 + uVar8;
      uVar2 = plVar13[-2] + lVar7 + plVar13[-1];
      uVar11 = uVar2 + *plVar13;
      uVar2 = (uVar2 * 0x100000 | uVar2 >> 0x2c) + lVar7 + (uVar4 << 0x2b | uVar4 >> 0x15);
      sVar9 = sVar9 - 0x80;
      plVar13 = plVar13 + 0x10;
    } while (0x7f < sVar9);
    uVar8 = uVar8 + uVar10 + (uVar11 * 0x8000000 | uVar11 >> 0x25) * -0x3c5a37a36834ced9;
    uVar5 = ((uVar10 + uVar3) * 0x8000 | uVar10 + uVar3 >> 0x31) * -0x3c5a37a36834ced9 + uVar5;
    if (sVar9 != 0) {
      plVar13 = (long *)(s + (len - 8));
      uVar10 = 0;
      do {
        uVar8 = ((uVar8 - uVar5) * 0x400000 | uVar8 - uVar5 >> 0x2a) * -0x3c5a37a36834ced9 + lVar6;
        lVar7 = uVar11 + plVar13[-1];
        uVar5 = (uVar5 << 0xf | uVar5 >> 0x31) * -0x3c5a37a36834ced9 + lVar7;
        uVar11 = lVar7 + uVar3;
        lVar7 = uVar3 + plVar13[-3];
        uVar4 = lVar6 + *plVar13 + lVar7;
        uVar12 = plVar13[-1] + plVar13[-2] + lVar7;
        uVar10 = uVar10 + 0x20;
        uVar3 = uVar12 + *plVar13;
        lVar6 = (uVar12 * 0x100000 | uVar12 >> 0x2c) + lVar7 + (uVar4 << 0x2b | uVar4 >> 0x15);
        plVar13 = plVar13 + -4;
      } while (uVar10 < sVar9);
    }
    uVar5 = (uVar5 ^ uVar3) * -0x622015f714c7d297;
    uVar5 = (uVar5 >> 0x2f ^ uVar3 ^ uVar5) * -0x622015f714c7d297;
    lVar7 = (uVar5 >> 0x2f ^ uVar5) * -0x622015f714c7d297;
    uVar5 = (uVar8 ^ uVar11) * -0x622015f714c7d297;
    uVar10 = (uVar5 >> 0x2f ^ uVar11 ^ uVar5) * -0x622015f714c7d297;
    uVar10 = uVar10 >> 0x2f ^ uVar10;
    uVar5 = (lVar7 + lVar6 ^ uVar2) * -0x622015f714c7d297;
    uVar5 = (uVar5 >> 0x2f ^ uVar2 ^ uVar5) * -0x622015f714c7d297;
    uVar8 = ((uVar5 >> 0x2f ^ uVar5) + uVar10) * -0x622015f714c7d297;
    uVar10 = uVar10 * -0x622015f714c7d297 + lVar6;
    uVar5 = lVar7 + uVar2 ^ uVar10;
  }
  uVar5 = (uVar5 * -0x622015f714c7d297 >> 0x2f ^ uVar10 ^ uVar5 * -0x622015f714c7d297) *
          -0x622015f714c7d297;
  uVar14.second = (uVar5 >> 0x2f ^ uVar5) * -0x622015f714c7d297;
  uVar14.first = uVar8;
  return uVar14;
}

Assistant:

uint128 CityHash128WithSeed(const char *s, size_t len, uint128 seed) {
  if (len < 128) {
    return CityMurmur(s, len, seed);
  }

  // We expect len >= 128 to be the common case.  Keep 56 bytes of state:
  // v, w, x, y, and z.
  pair<uint64, uint64> v, w;
  uint64 x = Uint128Low64(seed);
  uint64 y = Uint128High64(seed);
  uint64 z = len * k1;
  v.first = Rotate(y ^ k1, 49) * k1 + Fetch64(s);
  v.second = Rotate(v.first, 42) * k1 + Fetch64(s + 8);
  w.first = Rotate(y + z, 35) * k1 + x;
  w.second = Rotate(x + Fetch64(s + 88), 53) * k1;

  // This is the same inner loop as CityHash64(), manually unrolled.
  do {
    x = Rotate(x + y + v.first + Fetch64(s + 16), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y ^= v.first;
    z = Rotate(z ^ w.first, 33);
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y);
    std::swap(z, x);
    s += 64;
    x = Rotate(x + y + v.first + Fetch64(s + 16), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y ^= v.first;
    z = Rotate(z ^ w.first, 33);
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y);
    std::swap(z, x);
    s += 64;
    len -= 128;
  } while (LIKELY(len >= 128));
  y += Rotate(w.first, 37) * k0 + z;
  x += Rotate(v.first + z, 49) * k0;
  // If 0 < len < 128, hash up to 4 chunks of 32 bytes each from the end of s.
  for (size_t tail_done = 0; tail_done < len; ) {
    tail_done += 32;
    y = Rotate(y - x, 42) * k0 + v.second;
    w.first += Fetch64(s + len - tail_done + 16);
    x = Rotate(x, 49) * k0 + w.first;
    w.first += v.first;
    v = WeakHashLen32WithSeeds(s + len - tail_done, v.first, v.second);
  }
  // At this point our 48 bytes of state should contain more than
  // enough information for a strong 128-bit hash.  We use two
  // different 48-byte-to-8-byte hashes to get a 16-byte final result.
  x = HashLen16(x, v.first);
  y = HashLen16(y, w.first);
  return uint128(HashLen16(x + v.second, w.second) + y,
                 HashLen16(x + w.second, y + v.second));
}